

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffexts(char *extspec,int *extnum,char *extname,int *extvers,int *hdutype,char *imagecolname,
          char *rowexpress,int *status)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  int *piVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  char tmpname [71];
  char *local_98;
  long local_90;
  char *local_88;
  int *local_80;
  long local_78 [9];
  
  *extnum = 0;
  *extname = '\0';
  *extvers = 0;
  *hdutype = -1;
  *imagecolname = '\0';
  *rowexpress = '\0';
  if (0 < *status) {
    return *status;
  }
  pcVar11 = extspec + -1;
  do {
    cVar1 = pcVar11[1];
    pcVar11 = pcVar11 + 1;
  } while ((long)cVar1 == 0x20);
  local_88 = imagecolname;
  local_80 = hdutype;
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 8) == 0) {
LAB_00127c17:
    sVar6 = strcspn(pcVar11,",:;");
    iVar10 = (int)sVar6;
    if (0x46 < iVar10) goto LAB_00127ecc;
    strncat(extname,pcVar11,(long)iVar10);
    if (0 < iVar10) {
      do {
        iVar10 = (int)sVar6;
        if (extname[(sVar6 & 0xffffffff) - 1] != ' ') goto LAB_00127c5e;
        extname[(sVar6 & 0xffffffff) - 1] = '\0';
        sVar6 = (size_t)(iVar10 - 1);
      } while (1 < iVar10);
      iVar10 = 0;
    }
LAB_00127c5e:
    sVar6 = strspn(pcVar11 + iVar10," ,:");
    local_90 = (long)(int)sVar6;
    pcVar8 = pcVar11 + iVar10 + local_90;
    sVar6 = strcspn(pcVar8," ,:;");
    if ((int)sVar6 == 0) {
      strcpy((char *)local_78,extname);
      ffupch((char *)local_78);
      if (local_78[0] == 0x5952414d495250 || (short)local_78[0] == 0x50) {
        *extname = '\0';
      }
    }
    else {
      iVar2 = __isoc99_sscanf(pcVar8,"%d",extvers);
      if (iVar2 != 1) {
        ffpmsg("illegal EXTVER value in input URL:");
        ffpmsg(extspec);
        *status = 0x7d;
        return 0x7d;
      }
      lVar5 = iVar10 + local_90 + (long)(int)sVar6;
      sVar6 = strspn(pcVar11 + lVar5," ,:");
      lVar5 = (int)sVar6 + lVar5;
      pcVar8 = pcVar11 + lVar5;
      sVar6 = strcspn(pcVar8,";");
      if ((int)sVar6 != 0) {
        uVar7 = (ulong)((byte)pcVar11[lVar5] - 0x41);
        if (0x33 < (byte)pcVar11[lVar5] - 0x41) {
LAB_00127eb6:
          pcVar11 = "unknown type of HDU in input URL:";
          goto LAB_00127ebd;
        }
        if ((0x8000100080001U >> (uVar7 & 0x3f) & 1) == 0) {
          if ((0x200000002U >> (uVar7 & 0x3f) & 1) == 0) {
            if ((0x10000000100U >> (uVar7 & 0x3f) & 1) == 0) goto LAB_00127eb6;
            *local_80 = 0;
          }
          else {
            *local_80 = 2;
          }
        }
        else {
          *local_80 = 1;
        }
      }
    }
LAB_00127de6:
    pcVar8 = strchr(pcVar8,0x3b);
    pcVar11 = pcVar8;
    if (pcVar8 == (char *)0x0) {
LAB_00127e86:
      return *status;
    }
    do {
      pcVar8 = pcVar8 + 1;
      pcVar9 = pcVar11 + 1;
      pcVar11 = pcVar11 + 1;
    } while (*pcVar9 == ' ');
    pcVar9 = strchr(pcVar11,0x28);
    if (pcVar9 == (char *)0x0) {
      ffpmsg("illegal specification of image in table cell in input URL:");
      pcVar11 = " did not find a row expression enclosed in ( )";
    }
    else {
      if (0x400 < (long)pcVar9 - (long)pcVar8) goto LAB_00127ecc;
      strncat(local_88,pcVar11,(long)pcVar9 - (long)pcVar8);
      pcVar11 = pcVar9;
      do {
        pcVar9 = pcVar9 + 1;
        pcVar8 = pcVar11 + 1;
        pcVar11 = pcVar11 + 1;
      } while (*pcVar8 == ' ');
      pcVar8 = strchr(pcVar11,0x29);
      if (pcVar8 != (char *)0x0) {
        if ((long)pcVar8 - (long)pcVar9 < 0x401) {
          strncat(rowexpress,pcVar11,(long)pcVar8 - (long)pcVar9);
          goto LAB_00127e86;
        }
        goto LAB_00127ecc;
      }
      ffpmsg("illegal specification of image in table cell in input URL:");
      pcVar11 = " missing closing \')\' character in row expression";
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0;
    lVar5 = strtol(pcVar11,&local_98,10);
    *extnum = (uint)lVar5;
    for (; cVar1 = *local_98, cVar1 == ' '; local_98 = local_98 + 1) {
    }
    if (((cVar1 == '\0') || (cVar1 == ';')) && (*piVar4 != 0x22)) {
      pcVar8 = pcVar11;
      if (99999 < (uint)lVar5) goto LAB_00127c05;
      goto LAB_00127de6;
    }
    *extnum = 0;
    *piVar4 = 0;
    if ((uint)*extnum < 100000) goto LAB_00127c17;
LAB_00127c05:
    *extnum = 0;
    pcVar11 = "specified extension number is out of range:";
  }
LAB_00127ebd:
  ffpmsg(pcVar11);
  ffpmsg(extspec);
LAB_00127ecc:
  *status = 0x7d;
  return 0x7d;
}

Assistant:

int ffexts(char *extspec, 
                       int *extnum, 
                       char *extname,
                       int *extvers,
                       int *hdutype,
                       char *imagecolname,
                       char *rowexpress,
                       int *status)
{
/*
   Parse the input extension specification string, returning either the
   extension number or the values of the EXTNAME, EXTVERS, and XTENSION
   keywords in desired extension. Also return the name of the column containing
   an image, and an expression to be used to determine which row to use,
   if present.
*/
    char *ptr1, *ptr2;
    int slen, nvals;
    int notint = 1; /* initially assume specified extname is not an integer */
    char tmpname[FLEN_VALUE], *loc;

    *extnum = 0;
    *extname = '\0';
    *extvers = 0;
    *hdutype = ANY_HDU;
    *imagecolname = '\0';
    *rowexpress = '\0';

    if (*status > 0)
        return(*status);

    ptr1 = extspec;       /* pointer to first char */

    while (*ptr1 == ' ')  /* skip over any leading blanks */
        ptr1++;

    if (isdigit((int) *ptr1))  /* is the extension specification a number? */
    {
        notint = 0;  /* looks like extname may actually be the ext. number */
        errno = 0;  /* reset this prior to calling strtol */
        *extnum = strtol(ptr1, &loc, 10);  /* read the string as an integer */

        while (*loc == ' ')  /* skip over trailing blanks */
           loc++;

        /* check for read error, or junk following the integer */
        if ((*loc != '\0' && *loc != ';' ) || (errno == ERANGE) )
        {
           *extnum = 0;
           notint = 1;  /* no, extname was not a simple integer after all */
           errno = 0;  /* reset error condition flag if it was set */
        }

        if ( *extnum < 0 || *extnum > 99999)
        {
            *extnum = 0;   /* this is not a reasonable extension number */
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }


/*  This logic was too simple, and failed on extnames like '1000TEMP' 
    where it would try to move to the 1000th extension

    if (isdigit((int) *ptr1))  
    {
        sscanf(ptr1, "%d", extnum);
        if (*extnum < 0 || *extnum > 9999)
        {
            *extnum = 0;   
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }
*/

    if (notint)
    {
           /* not a number, so EXTNAME must be specified, followed by */
           /* optional EXTVERS and XTENSION  values */

           /* don't use space char as end indicator, because there */
           /* may be imbedded spaces in the EXTNAME value */
           slen = strcspn(ptr1, ",:;");   /* length of EXTNAME */

	   if (slen > FLEN_VALUE - 1)
	   {
                return(*status = URL_PARSE_ERROR); 
           }
 
           strncat(extname, ptr1, slen);  /* EXTNAME value */

           /* now remove any trailing blanks */
           while (slen > 0 && *(extname + slen -1) == ' ')
           {
               *(extname + slen -1) = '\0';
               slen--;
           }

           ptr1 += slen;
           slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
           ptr1 += slen;

           slen = strcspn(ptr1, " ,:;");   /* length of EXTVERS */
           if (slen)
           {
               nvals = sscanf(ptr1, "%d", extvers);  /* EXTVERS value */
               if (nvals != 1)
               {
                   ffpmsg("illegal EXTVER value in input URL:");
                   ffpmsg(extspec);
                   return(*status = URL_PARSE_ERROR);
               }

               ptr1 += slen;
               slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
               ptr1 += slen;

               slen = strcspn(ptr1, ";");   /* length of HDUTYPE */
               if (slen)
               {
                 if (*ptr1 == 'b' || *ptr1 == 'B')
                     *hdutype = BINARY_TBL;  
                 else if (*ptr1 == 't' || *ptr1 == 'T' ||
                          *ptr1 == 'a' || *ptr1 == 'A')
                     *hdutype = ASCII_TBL;
                 else if (*ptr1 == 'i' || *ptr1 == 'I')
                     *hdutype = IMAGE_HDU;
                 else
                 {
                     ffpmsg("unknown type of HDU in input URL:");
                     ffpmsg(extspec);
                     return(*status = URL_PARSE_ERROR);
                 }
               }
           }
           else
           {
                strcpy(tmpname, extname);
                ffupch(tmpname);
                if (!strcmp(tmpname, "PRIMARY") || !strcmp(tmpname, "P") )
                    *extname = '\0';  /* return extnum = 0 */
           }
    }

    ptr1 = strchr(ptr1, ';');
    if (ptr1)
    {
        /* an image is to be opened; the image is contained in a single */
        /* cell of a binary table.  A column name and an expression to  */
        /* determine which row to use has been entered.                 */

        ptr1++;  /* skip over the ';' delimiter */
        while (*ptr1 == ' ')  /* skip over any leading blanks */
            ptr1++;

        ptr2 = strchr(ptr1, '(');
        if (!ptr2)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" did not find a row expression enclosed in ( )");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
	{
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(imagecolname, ptr1, ptr2 - ptr1); /* copy column name */

        ptr2++;  /* skip over the '(' delimiter */
        while (*ptr2 == ' ')  /* skip over any leading blanks */
            ptr2++;


        ptr1 = strchr(ptr2, ')');
        if (!ptr1)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" missing closing ')' character in row expression");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr1 - ptr2 > FLEN_FILENAME - 1)
        {
                return(*status = URL_PARSE_ERROR); 
        }
 
        strncat(rowexpress, ptr2, ptr1 - ptr2); /* row expression */
    }

    return(*status);
}